

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::VisibleSurface::VisibleSurface
          (VisibleSurface *this,SurfaceInteraction *si,CameraTransform *cameraTransform,
          SampledSpectrum *albedo,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Transform local_98;
  
  this->set = false;
  (this->p).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->p).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(this->p).super_Tuple3<pbrt::Point3,_float>.z = 0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(this->ns).super_Tuple3<pbrt::Normal3,_float>.z = 0;
  this->dzdx = 0.0;
  this->dzdy = 0.0;
  uVar3 = *(undefined8 *)((albedo->values).values + 2);
  *(undefined8 *)(this->albedo).values.values = *(undefined8 *)(albedo->values).values;
  *(undefined8 *)((this->albedo).values.values + 2) = uVar3;
  this->set = true;
  AnimatedTransform::Interpolate
            (&local_98,&cameraTransform->renderFromCamera,(si->super_Interaction).time);
  auVar16._8_8_ = 0;
  auVar16._0_4_ = local_98.m.m[0][0];
  auVar16._4_4_ = local_98.m.m[0][1];
  auVar15._8_8_ = 0;
  auVar15._0_4_ = local_98.m.m[2][0];
  auVar15._4_4_ = local_98.m.m[2][1];
  auVar5 = vaddss_avx512f(ZEXT416((uint)(si->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low),
                          ZEXT416((uint)(si->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high));
  auVar6 = vaddss_avx512f(ZEXT416((uint)(si->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                          ZEXT416((uint)(si->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high));
  auVar5 = vmulss_avx512f(auVar5,ZEXT416(0x3f000000));
  auVar7 = vmulss_avx512f(ZEXT416((uint)((si->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
                                        (si->super_Interaction).pi.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high)),
                          ZEXT416(0x3f000000));
  auVar6 = vmulss_avx512f(auVar6,ZEXT416(0x3f000000));
  auVar8 = vmulss_avx512f(ZEXT416((uint)local_98.mInv.m[0][1]),auVar5);
  auVar9 = vmulss_avx512f(ZEXT416((uint)local_98.mInv.m[1][1]),auVar5);
  auVar10 = vmulss_avx512f(ZEXT416((uint)local_98.mInv.m[2][1]),auVar5);
  auVar5 = vmulss_avx512f(auVar5,ZEXT416((uint)local_98.mInv.m[3][1]));
  auVar5 = vfmadd231ss_avx512f(auVar5,auVar7,ZEXT416((uint)local_98.mInv.m[3][0]));
  auVar8 = vfmadd231ss_avx512f(auVar8,ZEXT416((uint)local_98.mInv.m[0][0]),auVar7);
  auVar9 = vfmadd231ss_avx512f(auVar9,ZEXT416((uint)local_98.mInv.m[1][0]),auVar7);
  auVar7 = vfmadd231ss_avx512f(auVar10,ZEXT416((uint)local_98.mInv.m[2][0]),auVar7);
  auVar5 = vfmadd231ss_avx512f(auVar5,auVar6,ZEXT416((uint)local_98.mInv.m[3][2]));
  auVar8 = vfmadd231ss_avx512f(auVar8,ZEXT416((uint)local_98.mInv.m[0][2]),auVar6);
  auVar9 = vfmadd231ss_avx512f(auVar9,ZEXT416((uint)local_98.mInv.m[1][2]),auVar6);
  auVar8 = vaddss_avx512f(auVar8,ZEXT416((uint)local_98.mInv.m[0][3]));
  auVar9 = vaddss_avx512f(auVar9,ZEXT416((uint)local_98.mInv.m[1][3]));
  auVar6 = vfmadd231ss_avx512f(auVar7,ZEXT416((uint)local_98.mInv.m[2][2]),auVar6);
  auVar6 = vaddss_avx512f(auVar6,ZEXT416((uint)local_98.mInv.m[2][3]));
  auVar5 = vaddss_avx512f(auVar5,ZEXT416((uint)local_98.mInv.m[3][3]));
  bVar4 = auVar5._0_4_ == 1.0;
  auVar7 = vdivss_avx512f(auVar8,auVar5);
  auVar10 = vdivss_avx512f(auVar9,auVar5);
  auVar11 = vdivss_avx512f(auVar6,auVar5);
  auVar5._4_12_ = auVar7._4_12_;
  auVar5._0_4_ = (uint)bVar4 * auVar8._0_4_ + (uint)!bVar4 * auVar7._0_4_;
  auVar7._4_12_ = auVar10._4_12_;
  auVar7._0_4_ = (uint)bVar4 * auVar9._0_4_ + (uint)!bVar4 * auVar10._0_4_;
  auVar5 = vinsertps_avx512f(auVar5,auVar7,0x10);
  uVar3 = vmovlps_avx512f(auVar5);
  (this->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (this->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->p).super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar4 * auVar6._0_4_ + (uint)!bVar4 * auVar11._0_4_);
  fVar14 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5 = vmulss_avx512f(ZEXT416((uint)local_98.mInv.m[0][1]),ZEXT416((uint)fVar14));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.mInv.m[0][0]));
  auVar6 = vmulss_avx512f(ZEXT416((uint)local_98.mInv.m[1][1]),ZEXT416((uint)fVar14));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.mInv.m[1][0]));
  auVar7 = vmulss_avx512f(ZEXT416((uint)local_98.mInv.m[2][1]),ZEXT416((uint)fVar14));
  auVar8 = vbroadcastss_avx512vl
                     (ZEXT416((uint)(si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z))
  ;
  auVar9 = vfmadd231ss_avx512f(auVar5,ZEXT416((uint)fVar2),ZEXT416((uint)local_98.mInv.m[0][2]));
  fVar14 = (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar11._4_4_ = fVar14;
  auVar11._0_4_ = fVar14;
  auVar11._8_4_ = fVar14;
  auVar11._12_4_ = fVar14;
  auVar5 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_98.mInv.m[2][0]),ZEXT416((uint)fVar1));
  auVar7 = vfmadd231ss_avx512f(auVar6,ZEXT416((uint)fVar2),ZEXT416((uint)local_98.mInv.m[1][2]));
  fVar14 = (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar10 = vfmadd231ss_avx512f(auVar5,ZEXT416((uint)local_98.mInv.m[2][2]),ZEXT416((uint)fVar2));
  auVar12._0_4_ = fVar14 * local_98.m.m[1][0];
  auVar12._4_4_ = fVar14 * local_98.m.m[1][1];
  auVar12._8_4_ = fVar14 * 0.0;
  auVar12._12_4_ = fVar14 * 0.0;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m.m[1][2] * fVar14)),
                           ZEXT416((uint)local_98.m.m[0][2]),auVar11);
  auVar5 = vfmadd231ps_fma(auVar12,auVar16,auVar11);
  auVar11 = vfmadd231ss_avx512f(auVar6,ZEXT416((uint)local_98.m.m[2][2]),auVar8);
  auVar8 = vfmadd231ps_avx512vl(auVar5,auVar15,auVar8);
  auVar5 = vmovshdup_avx(auVar8);
  auVar6 = ZEXT416((uint)(auVar10._0_4_ * auVar11._0_4_));
  auVar5 = vfmadd213ss_fma(auVar5,auVar7,auVar6);
  auVar6 = vfmsub231ss_fma(auVar6,auVar11,auVar10);
  auVar5 = vaddss_avx512f(auVar5,auVar6);
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar12 = vfmadd231ss_avx512f(auVar5,auVar8,auVar9);
  auVar5 = vucomiss_avx512f(auVar12);
  auVar13 = vxorps_avx512vl(auVar11,auVar13);
  auVar6 = auVar8;
  if (bVar4) {
    auVar6._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
    auVar6._8_4_ = auVar8._8_4_ ^ 0x80000000;
    auVar6._12_4_ = auVar8._12_4_ ^ 0x80000000;
  }
  uVar3 = vcmpss_avx512f(auVar12,auVar5,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  uVar3 = vmovlps_avx(auVar6);
  (this->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
  (this->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->n).super_Tuple3<pbrt::Normal3,_float>.z =
       (float)((uint)bVar4 * auVar13._0_4_ + (uint)!bVar4 * (int)auVar11._0_4_);
  fVar14 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  fVar1 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar19._4_4_ = fVar1;
  auVar19._0_4_ = fVar1;
  auVar19._8_4_ = fVar1;
  auVar19._12_4_ = fVar1;
  auVar17._0_4_ = fVar14 * local_98.m.m[1][0];
  auVar17._4_4_ = fVar14 * local_98.m.m[1][1];
  auVar17._8_4_ = fVar14 * 0.0;
  auVar17._12_4_ = fVar14 * 0.0;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_98.m.m[0][2]),auVar19,
                           ZEXT416((uint)(local_98.m.m[1][2] * fVar14)));
  fVar14 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar18._4_4_ = fVar14;
  auVar18._0_4_ = fVar14;
  auVar18._8_4_ = fVar14;
  auVar18._12_4_ = fVar14;
  auVar6 = vfmadd213ps_fma(auVar16,auVar19,auVar17);
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)local_98.m.m[2][2]),auVar18,auVar8);
  auVar8 = vfmadd213ps_fma(auVar15,auVar18,auVar6);
  fVar14 = auVar11._0_4_;
  auVar6 = vmovshdup_avx(auVar8);
  auVar12 = ZEXT416((uint)(auVar10._0_4_ * fVar14));
  auVar10 = vfmsub213ss_fma(auVar10,auVar11,auVar12);
  auVar6 = vfmadd213ss_fma(auVar7,auVar6,auVar12);
  auVar6 = vfmadd213ss_fma(auVar9,auVar8,ZEXT416((uint)(auVar6._0_4_ + auVar10._0_4_)));
  auVar9 = auVar8;
  if (auVar6._0_4_ < auVar5._0_4_) {
    auVar9._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
    auVar9._8_4_ = auVar8._8_4_ ^ 0x80000000;
    auVar9._12_4_ = auVar8._12_4_ ^ 0x80000000;
  }
  uVar3 = vcmpss_avx512f(auVar6,auVar5,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  uVar3 = vmovlps_avx(auVar9);
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->ns).super_Tuple3<pbrt::Normal3,_float>.z =
       (float)((uint)bVar4 * (int)-fVar14 + (uint)!bVar4 * (int)fVar14);
  this->time = (si->super_Interaction).time;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_98.mInv.m[2][1] *
                                         (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)local_98.mInv.m[2][0]),
                           ZEXT416((uint)(si->dpdx).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_98.mInv.m[2][2]),
                           ZEXT416((uint)(si->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
  this->dzdx = auVar5._0_4_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_98.mInv.m[2][1] *
                                         (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.y)),
                           ZEXT416((uint)local_98.mInv.m[2][0]),
                           ZEXT416((uint)(si->dpdy).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_98.mInv.m[2][2]),
                           ZEXT416((uint)(si->dpdy).super_Tuple3<pbrt::Vector3,_float>.z));
  this->dzdy = auVar5._0_4_;
  return;
}

Assistant:

VisibleSurface::VisibleSurface(const SurfaceInteraction &si,
                               const CameraTransform &cameraTransform,
                               const SampledSpectrum &albedo,
                               const SampledWavelengths &lambda)
    : albedo(albedo) {
    set = true;
    // Initialize geometric _VisibleSurface_ members
    Transform cameraFromRender = cameraTransform.CameraFromRender(si.time);
    p = cameraFromRender(si.p());
    Vector3f wo = cameraFromRender(si.wo);
    n = FaceForward(cameraFromRender(si.n), wo);
    ns = FaceForward(cameraFromRender(si.shading.n), wo);
    time = si.time;
    dzdx = cameraFromRender(si.dpdx).z;
    dzdy = cameraFromRender(si.dpdy).z;
}